

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O0

void __thiscall
crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::split_alternative_node_task
          (tree_clusterizer<crnlib::vec<16U,_float>_> *this,uint64 param_1,void *pData_ptr)

{
  uint index;
  vq_node *pvVar1;
  vq_node *pvVar2;
  node_vec_type *this_00;
  bool local_89;
  NodeInfo local_5c;
  uint local_54;
  uint local_50;
  uint splits;
  uint end_node;
  uint begin_node;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  node_queue;
  split_alternative_node_task_params *pParams;
  void *pData_ptr_local;
  uint64 param_1_local;
  tree_clusterizer<crnlib::vec<16U,_float>_> *this_local;
  
  node_queue._24_8_ = pData_ptr;
  std::
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<16u,float>>::NodeInfo,std::vector<crnlib::tree_clusterizer<crnlib::vec<16u,float>>::NodeInfo,std::allocator<crnlib::tree_clusterizer<crnlib::vec<16u,float>>::NodeInfo>>,std::less<crnlib::tree_clusterizer<crnlib::vec<16u,float>>::NodeInfo>>
  ::
  priority_queue<std::vector<crnlib::tree_clusterizer<crnlib::vec<16u,float>>::NodeInfo,std::allocator<crnlib::tree_clusterizer<crnlib::vec<16u,float>>::NodeInfo>>,void>
            ((priority_queue<crnlib::tree_clusterizer<crnlib::vec<16u,float>>::NodeInfo,std::vector<crnlib::tree_clusterizer<crnlib::vec<16u,float>>::NodeInfo,std::allocator<crnlib::tree_clusterizer<crnlib::vec<16u,float>>::NodeInfo>>,std::less<crnlib::tree_clusterizer<crnlib::vec<16u,float>>::NodeInfo>>
              *)&end_node);
  local_50 = *(uint *)(node_queue._24_8_ + 4);
  local_54 = 0;
  this_00 = &this->m_nodes;
  splits = local_50;
  pvVar1 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                     (this_00,*(uint *)node_queue._24_8_);
  pvVar2 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                     (this_00,local_50);
  vq_node::operator=(pvVar2,pvVar1);
  index = local_50;
  pvVar1 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                     (this_00,local_50);
  NodeInfo::NodeInfo(&local_5c,index,pvVar1->m_variance);
  std::
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  ::push((priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
          *)&end_node,&local_5c);
  local_50 = local_50 + 1;
  do {
    local_54 = local_54 + 1;
    local_89 = false;
    if (local_54 < *(uint *)(node_queue._24_8_ + 8)) {
      local_89 = split_node(this,(priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                                  *)&end_node,&local_50,(task_pool *)0x0);
    }
  } while (local_89 != false);
  pvVar1 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                     (&this->m_nodes,*(uint *)(node_queue._24_8_ + 4));
  pvVar2 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                     (&this->m_nodes,*(uint *)node_queue._24_8_);
  vq_node::operator=(pvVar2,pvVar1);
  pvVar1 = vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::vq_node>::operator[]
                     (&this->m_nodes,*(uint *)node_queue._24_8_);
  pvVar1->m_alternative = true;
  std::
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  ::~priority_queue((priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                     *)&end_node);
  return;
}

Assistant:

void split_alternative_node_task(uint64, void* pData_ptr)
        {
            split_alternative_node_task_params* pParams = (split_alternative_node_task_params*)pData_ptr;
            std::priority_queue<NodeInfo> node_queue;
            uint begin_node = pParams->alternative_node, end_node = begin_node, splits = 0;

            m_nodes[end_node] = m_nodes[pParams->main_node];
            node_queue.push(NodeInfo(end_node, m_nodes[end_node].m_variance));
            end_node++;
            splits++;

            while (splits < pParams->max_splits && split_node(node_queue, end_node))
            {
                splits++;
            }

            m_nodes[pParams->main_node] = m_nodes[pParams->alternative_node];
            m_nodes[pParams->main_node].m_alternative = true;
        }